

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

Kit_DsdNtk_t * Kit_DsdNtkAlloc(int nVars)

{
  Kit_DsdNtk_t *pKVar1;
  Kit_DsdObj_t **ppKVar2;
  uint *puVar3;
  int iVar4;
  
  pKVar1 = (Kit_DsdNtk_t *)malloc(0x20);
  pKVar1->nVars = 0;
  pKVar1->nNodesAlloc = 0;
  pKVar1->nNodes = 0;
  pKVar1->Root = 0;
  pKVar1->pMem = (uint *)0x0;
  pKVar1->pSupps = (uint *)0x0;
  pKVar1->pNodes = (Kit_DsdObj_t **)0x0;
  ppKVar2 = (Kit_DsdObj_t **)malloc((long)nVars * 8 + 8);
  pKVar1->pNodes = ppKVar2;
  pKVar1->nVars = (unsigned_short)nVars;
  pKVar1->nNodesAlloc = (unsigned_short)nVars + 1;
  iVar4 = 6 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    iVar4 = 6;
  }
  puVar3 = (uint *)malloc((long)iVar4 << 2);
  pKVar1->pMem = puVar3;
  return pKVar1;
}

Assistant:

Kit_DsdNtk_t * Kit_DsdNtkAlloc( int nVars )
{
    Kit_DsdNtk_t * pNtk;
    pNtk = ABC_ALLOC( Kit_DsdNtk_t, 1 );
    memset( pNtk, 0, sizeof(Kit_DsdNtk_t) );
    pNtk->pNodes = ABC_ALLOC( Kit_DsdObj_t *, nVars+1 );
    pNtk->nVars = nVars;
    pNtk->nNodesAlloc = nVars+1;
    pNtk->pMem = ABC_ALLOC( unsigned, 6 * Kit_TruthWordNum(nVars) );
    return pNtk;
}